

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# annotator.cpp
# Opt level: O0

void __thiscall
Annotator_assignUnitsItemIdBadInput_Test::TestBody(Annotator_assignUnitsItemIdBadInput_Test *this)

{
  bool bVar1;
  char *pcVar2;
  AssertHelper local_f0 [8];
  Message local_e8 [8];
  shared_ptr<libcellml::Units> local_e0;
  shared_ptr<libcellml::UnitsItem> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  Message local_88 [24];
  shared_ptr<libcellml::Units> local_70;
  shared_ptr<libcellml::UnitsItem> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  undefined1 local_30 [8];
  AssertionResult gtest_ar;
  AnnotatorPtr annotator;
  Annotator_assignUnitsItemIdBadInput_Test *this_local;
  
  libcellml::Annotator::create();
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  std::shared_ptr<libcellml::Units>::shared_ptr(&local_70,(nullptr_t)0x0);
  libcellml::UnitsItem::create((shared_ptr *)&local_60,(ulong)&local_70);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_50);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_30,"\"\"",
             "annotator->assignId(libcellml::UnitsItem::create(nullptr, 0))",(char (*) [1])0x19fc0a,
             &local_50);
  std::__cxx11::string::~string((string *)&local_50);
  std::shared_ptr<libcellml::UnitsItem>::~shared_ptr(&local_60);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_70);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_30);
  if (!bVar1) {
    testing::Message::Message(local_88);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_30);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x484,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_30);
  std::__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
  operator->((__shared_ptr_access<libcellml::Annotator,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             &gtest_ar.message_);
  std::shared_ptr<libcellml::Units>::shared_ptr(&local_e0,(nullptr_t)0x0);
  std::numeric_limits<unsigned_long>::max();
  libcellml::UnitsItem::create((shared_ptr *)&local_d0,(ulong)&local_e0);
  libcellml::Annotator::assignId_abi_cxx11_((shared_ptr *)&local_c0);
  testing::internal::EqHelper<false>::Compare<char[1],std::__cxx11::string>
            ((EqHelper<false> *)local_a0,"\"\"",
             "annotator->assignId(libcellml::UnitsItem::create(nullptr, std::numeric_limits<size_t>::max()))"
             ,(char (*) [1])0x19fc0a,&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::shared_ptr<libcellml::UnitsItem>::~shared_ptr(&local_d0);
  std::shared_ptr<libcellml::Units>::~shared_ptr(&local_e0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(local_e8);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              (local_f0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/annotator/annotator.cpp"
               ,0x485,pcVar2);
    testing::internal::AssertHelper::operator=(local_f0,local_e8);
    testing::internal::AssertHelper::~AssertHelper(local_f0);
    testing::Message::~Message(local_e8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  std::shared_ptr<libcellml::Annotator>::~shared_ptr
            ((shared_ptr<libcellml::Annotator> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(Annotator, assignUnitsItemIdBadInput)
{
    auto annotator = libcellml::Annotator::create();
    EXPECT_EQ("", annotator->assignId(libcellml::UnitsItem::create(nullptr, 0)));
    EXPECT_EQ("", annotator->assignId(libcellml::UnitsItem::create(nullptr, std::numeric_limits<size_t>::max())));
}